

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int aom_vector_push_back(Vector *vector,void *element)

{
  _Bool _Var1;
  Vector *in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  _Var1 = _vector_should_grow(in_RDI);
  if ((_Var1) && (iVar2 = _vector_adjust_capacity(in_RDI), iVar2 == -1)) {
    iVar2 = -1;
  }
  else {
    _vector_assign((Vector *)element,CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   in_RDI);
    in_RDI->size = in_RDI->size + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int aom_vector_push_back(Vector *vector, void *element) {
  assert(vector != NULL);
  assert(element != NULL);

  if (_vector_should_grow(vector)) {
    if (_vector_adjust_capacity(vector) == VECTOR_ERROR) {
      return VECTOR_ERROR;
    }
  }

  _vector_assign(vector, vector->size, element);

  ++vector->size;

  return VECTOR_SUCCESS;
}